

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

drmp3_uint64 drmp3_read_pcm_frames_f32(drmp3 *pMP3,drmp3_uint64 framesToRead,float *pBufferOut)

{
  drmp3_uint64 dVar1;
  long in_RDX;
  drmp3 *in_RSI;
  long in_RDI;
  drmp3_uint64 framesJustRead;
  drmp3_uint64 framesToReadRightNow;
  float temp [4096];
  drmp3_uint64 totalFramesRead;
  undefined8 in_stack_ffffffffffffbfd0;
  void *in_stack_ffffffffffffbfd8;
  drmp3_uint64 in_stack_ffffffffffffbfe0;
  drmp3_src *in_stack_ffffffffffffbfe8;
  drmp3_uint64 framesToRead_00;
  float *local_8;
  
  if ((in_RDI == 0) || (*(long *)(in_RDI + 0x1a28) == 0)) {
    local_8 = (float *)0x0;
  }
  else {
    local_8 = (float *)0x0;
    if (in_RDX == 0) {
      framesToRead_00 = 0;
      while ((in_RSI != (drmp3 *)0x0 &&
             (dVar1 = drmp3_read_pcm_frames_f32(in_RSI,framesToRead_00,local_8), dVar1 != 0))) {
        in_RSI = (drmp3 *)((long)in_RSI - dVar1);
        local_8 = (float *)(dVar1 + (long)local_8);
      }
    }
    else {
      local_8 = (float *)drmp3_src_read_frames_ex
                                   (in_stack_ffffffffffffbfe8,in_stack_ffffffffffffbfe0,
                                    in_stack_ffffffffffffbfd8,
                                    (drmp3_bool32)((ulong)in_stack_ffffffffffffbfd0 >> 0x20));
      *(long *)(in_RDI + 0x3e50) = (long)local_8 + *(long *)(in_RDI + 0x3e50);
    }
  }
  return (drmp3_uint64)local_8;
}

Assistant:

drmp3_uint64 drmp3_read_pcm_frames_f32(drmp3* pMP3, drmp3_uint64 framesToRead, float* pBufferOut)
{
    if (pMP3 == NULL || pMP3->onRead == NULL) {
        return 0;
    }

    drmp3_uint64 totalFramesRead = 0;

    if (pBufferOut == NULL) {
        float temp[4096];
        while (framesToRead > 0) {
            drmp3_uint64 framesToReadRightNow = sizeof(temp)/sizeof(temp[0]) / pMP3->channels;
            if (framesToReadRightNow > framesToRead) {
                framesToReadRightNow = framesToRead;
            }

            drmp3_uint64 framesJustRead = drmp3_read_pcm_frames_f32(pMP3, framesToReadRightNow, temp);
            if (framesJustRead == 0) {
                break;
            }

            framesToRead -= framesJustRead;
            totalFramesRead += framesJustRead;
        }
    } else {
        totalFramesRead = drmp3_src_read_frames_ex(&pMP3->src, framesToRead, pBufferOut, DRMP3_TRUE);
        pMP3->currentPCMFrame += totalFramesRead;
    }

    return totalFramesRead;
}